

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

void add_obj_to_summary(object *obj,void *closure)

{
  uint8_t uVar1;
  wchar_t wVar2;
  void *pvVar3;
  char *pcVar4;
  size_t sVar5;
  int local_38;
  int local_34;
  wchar_t j;
  wchar_t i;
  cached_object_data *cache;
  equippable *e;
  add_obj_to_summary_closure *c;
  void *closure_local;
  object *obj_local;
  
  e = (equippable *)closure;
  c = (add_obj_to_summary_closure *)closure;
  closure_local = obj;
  if (*(int *)(*(long *)((long)closure + 8) + 0x1d0) <=
      *(int *)(*(long *)((long)closure + 8) + 0x1cc)) {
    __assert_fail("c->summary->nitems < c->summary->nalloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-equip-cmp.c"
                  ,0x7ec,"void add_obj_to_summary(const struct object *, void *)");
  }
  cache = (cached_object_data *)
          (**(long **)((long)closure + 8) +
          (long)*(int *)(*(long *)((long)closure + 8) + 0x1cc) * 0x38);
  *(int *)(*(long *)((long)closure + 8) + 0x1cc) =
       *(int *)(*(long *)((long)closure + 8) + 0x1cc) + 1;
  if (*(long *)(cache[1].f + 3) == 0) {
    pvVar3 = mem_alloc((long)*(int *)(*(long *)((long)closure + 8) + 0x1d4) << 2);
    *(void **)(cache[1].f + 3) = pvVar3;
  }
  if (*(long *)(cache[3].f + 1) == 0) {
    pvVar3 = mem_alloc((long)e->vals[0x75] << 2);
    *(void **)(cache[3].f + 1) = pvVar3;
  }
  _j = (cached_object_data *)0x0;
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < e->vals[(long)local_34 * 0xe + 0x10]; local_38 = local_38 + 1) {
      compute_ui_entry_values_for_object
                (*(ui_entry **)(*(long *)(e->vals + (long)local_34 * 0xe + 10) + (long)local_38 * 8)
                 ,(object *)closure_local,(player *)e->short_name,(cached_object_data **)&j,
                 (wchar_t *)
                 (*(long *)(cache[1].f + 3) + (long)local_38 * 4 +
                 (long)e->vals[(long)local_34 * 0xe + 0x11] * 4),
                 (wchar_t *)
                 (*(long *)(cache[3].f + 1) + (long)local_38 * 4 +
                 (long)e->vals[(long)local_34 * 0xe + 0x11] * 4));
    }
  }
  release_cached_object_data(_j);
  if (0 < e->vals[0x77]) {
    string_free(*(char **)cache);
    pcVar4 = set_short_name((object *)closure_local,(long)e->vals[0x77],(player *)e->short_name);
    *(char **)cache = pcVar4;
    sVar5 = strlen(*(char **)cache);
    *(int *)(cache[8].f + 4) = (int)sVar5;
  }
  *(void **)(cache[4].f + 4) = closure_local;
  *(undefined4 *)(cache[6].f + 2) = *(undefined4 *)&e->auxvals;
  uVar1 = ignore_level_of((object *)closure_local);
  if (uVar1 == '\x01') {
    cache[7].f[1] = '\x04';
    cache[7].f[2] = '\0';
    cache[7].f[3] = '\0';
    cache[7].f[4] = '\0';
  }
  else if (uVar1 == '\x02') {
    cache[7].f[1] = '\x03';
    cache[7].f[2] = '\0';
    cache[7].f[3] = '\0';
    cache[7].f[4] = '\0';
  }
  else if (uVar1 == '\x03') {
    cache[7].f[1] = '\x02';
    cache[7].f[2] = '\0';
    cache[7].f[3] = '\0';
    cache[7].f[4] = '\0';
  }
  else if ((*(long *)((long)closure_local + 0x28) == 0) ||
          (*(long *)(*(long *)((long)closure_local + 0x28) + 0x10) == 0)) {
    if ((*(long *)((long)closure_local + 0x28) == 0) ||
       (*(long *)(*(long *)((long)closure_local + 0x28) + 8) == 0)) {
      cache[7].f[1] = '\x03';
      cache[7].f[2] = '\0';
      cache[7].f[3] = '\0';
      cache[7].f[4] = '\0';
    }
    else {
      cache[7].f[1] = '\x01';
      cache[7].f[2] = '\0';
      cache[7].f[3] = '\0';
      cache[7].f[4] = '\0';
    }
  }
  else {
    cache[7].f[1] = '\0';
    cache[7].f[2] = '\0';
    cache[7].f[3] = '\0';
    cache[7].f[4] = '\0';
  }
  wVar2 = wield_slot((object *)closure_local);
  *(wchar_t *)cache[8].f = wVar2;
  wVar2 = object_char((object *)closure_local);
  *(wchar_t *)(cache[9].f + 3) = wVar2;
  uVar1 = object_attr((object *)closure_local);
  cache[10].f[2] = uVar1;
  return;
}

Assistant:

static void add_obj_to_summary(const struct object *obj, void *closure)
{
	struct add_obj_to_summary_closure *c = closure;
	struct equippable *e;
	struct cached_object_data *cache;
	int i;

	assert(c->summary->nitems < c->summary->nalloc);
	e = c->summary->items + c->summary->nitems;
	++c->summary->nitems;

	if (!e->vals) {
		e->vals = mem_alloc(c->summary->nprop * sizeof(*e->vals));
	}
	if (!e->auxvals) {
		e->auxvals = mem_alloc(c->summary->nprop *
			sizeof(*e->auxvals));
	}
	cache = NULL;
	for (i = 0; i < (int)N_ELEMENTS(c->summary->propcats); ++i) {
		int j;

		for (j = 0; j < c->summary->propcats[i].n; ++j) {
			compute_ui_entry_values_for_object(
				c->summary->propcats[i].entries[j], obj,
				c->p, &cache,
				e->vals + j + c->summary->propcats[i].off,
				e->auxvals + j + c->summary->propcats[i].off);
		}
	}
	release_cached_object_data(cache);

	if (c->summary->nshortnm > 0) {
		string_free(e->short_name);
		e->short_name = set_short_name(obj, c->summary->nshortnm,
			c->p);
		e->nmlen = (int)strlen(e->short_name);
	}

	e->obj = obj;
	e->src = c->src;

	switch (ignore_level_of(obj)) {
	case IGNORE_GOOD:
		e->qual = EQUIP_QUAL_GOOD;
		break;

	case IGNORE_AVERAGE:
		e->qual = EQUIP_QUAL_AVERAGE;
		break;

	case IGNORE_BAD:
		e->qual = EQUIP_QUAL_BAD;
		break;

	default:
		/* Try to get some finer distinctions. */
		if (obj->known && obj->known->artifact) {
			e->qual = EQUIP_QUAL_ARTIFACT;
		} else if (obj->known && obj->known->ego) {
			e->qual = EQUIP_QUAL_EGO;
		} else {
			/* Treat unknown items as average. */
			e->qual = EQUIP_QUAL_AVERAGE;
		}
		break;
	}

	e->slot = wield_slot(obj);
	e->ch = object_char(obj);
	e->at = object_attr(obj);
}